

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateDescriptorDeclarations
          (MessageGenerator *this,Printer *printer)

{
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar1;
  Descriptor *pDVar2;
  string *value;
  long lVar3;
  long lVar4;
  string local_50;
  
  value = &this->classname_;
  io::Printer::Print(printer,
                     "const ::google::protobuf::Descriptor* $name$_descriptor_ = NULL;\nconst ::google::protobuf::internal::GeneratedMessageReflection*\n  $name$_reflection_ = NULL;\n"
                     ,"name",value);
  pDVar2 = this->descriptor_;
  if (0 < *(int *)(pDVar2 + 0x38)) {
    lVar3 = 0;
    do {
      psVar1 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->nested_generators_,lVar3);
      if (psVar1->ptr_ == (MessageGenerator *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cpp::MessageGenerator]"
                     );
      }
      GenerateDescriptorDeclarations(psVar1->ptr_,printer);
      lVar3 = lVar3 + 1;
      pDVar2 = this->descriptor_;
      value = (string *)(long)*(int *)(pDVar2 + 0x38);
    } while (lVar3 < (long)value);
  }
  if (0 < *(int *)(pDVar2 + 0x48)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      ClassName_abi_cxx11_
                (&local_50,(cpp *)(*(long *)(pDVar2 + 0x50) + lVar3),(EnumDescriptor *)0x0,
                 SUB81(value,0));
      io::Printer::Print(printer,
                         "const ::google::protobuf::EnumDescriptor* $name$_descriptor_ = NULL;\n",
                         "name",&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar4 = lVar4 + 1;
      pDVar2 = this->descriptor_;
      value = (string *)(long)*(int *)(pDVar2 + 0x48);
      lVar3 = lVar3 + 0x38;
    } while (lVar4 < (long)value);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateDescriptorDeclarations(io::Printer* printer) {
  printer->Print(
    "const ::google::protobuf::Descriptor* $name$_descriptor_ = NULL;\n"
    "const ::google::protobuf::internal::GeneratedMessageReflection*\n"
    "  $name$_reflection_ = NULL;\n",
    "name", classname_);

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateDescriptorDeclarations(printer);
  }

  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    printer->Print(
      "const ::google::protobuf::EnumDescriptor* $name$_descriptor_ = NULL;\n",
      "name", ClassName(descriptor_->enum_type(i), false));
  }
}